

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

char * flatbuffers::TypeName(BaseType t)

{
  char *pcStack_10;
  BaseType t_local;
  
  switch(t) {
  case BASE_TYPE_NONE:
    pcStack_10 = "";
    break;
  case BASE_TYPE_UTYPE:
    pcStack_10 = "";
    break;
  case BASE_TYPE_BOOL:
    pcStack_10 = "bool";
    break;
  case BASE_TYPE_CHAR:
    pcStack_10 = "byte";
    break;
  case BASE_TYPE_UCHAR:
    pcStack_10 = "ubyte";
    break;
  case BASE_TYPE_SHORT:
    pcStack_10 = "short";
    break;
  case BASE_TYPE_USHORT:
    pcStack_10 = "ushort";
    break;
  case BASE_TYPE_INT:
    pcStack_10 = "int";
    break;
  case BASE_TYPE_UINT:
    pcStack_10 = "uint";
    break;
  case BASE_TYPE_LONG:
    pcStack_10 = "long";
    break;
  case BASE_TYPE_ULONG:
    pcStack_10 = "ulong";
    break;
  case BASE_TYPE_FLOAT:
    pcStack_10 = "float";
    break;
  case BASE_TYPE_DOUBLE:
    pcStack_10 = "double";
    break;
  case BASE_TYPE_STRING:
    pcStack_10 = "string";
    break;
  case BASE_TYPE_VECTOR:
    pcStack_10 = "";
    break;
  case BASE_TYPE_STRUCT:
    pcStack_10 = "";
    break;
  case BASE_TYPE_UNION:
    pcStack_10 = "";
    break;
  case BASE_TYPE_ARRAY:
    pcStack_10 = "";
    break;
  case BASE_TYPE_VECTOR64:
    pcStack_10 = "";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0xaa,"const char *flatbuffers::TypeName(const BaseType)");
  }
  return pcStack_10;
}

Assistant:

inline const char* TypeName(const BaseType t) {
  switch (t) {
  #define FLATBUFFERS_TD(ENUM, IDLTYPE, ...) \
    case BASE_TYPE_##ENUM: return IDLTYPE;
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
  #undef FLATBUFFERS_TD
    default: FLATBUFFERS_ASSERT(0);
  }
  return nullptr;
}